

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mytools.cpp
# Opt level: O0

int myexec(char *cmd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resvec,bool dispResult)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  ostream *this;
  size_type sVar3;
  allocator local_459;
  string local_458 [31];
  char acStack_439 [9];
  char tmp [1024];
  FILE *pp;
  bool dispResult_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resvec_local;
  char *cmd_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(resvec);
  __stream = popen(cmd,"r");
  if (__stream == (FILE *)0x0) {
    cmd_local._4_4_ = -1;
  }
  else {
    while (pcVar1 = fgets(acStack_439 + 1,0x400,__stream), pcVar1 != (char *)0x0) {
      sVar2 = strlen(acStack_439 + 1);
      if (acStack_439[sVar2] == '\n') {
        sVar2 = strlen(acStack_439 + 1);
        acStack_439[sVar2] = '\0';
      }
      if (dispResult) {
        this = std::operator<<((ostream *)&std::cout,acStack_439 + 1);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_458,acStack_439 + 1,&local_459);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(resvec,(value_type *)local_458);
      std::__cxx11::string::~string(local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
    }
    pclose(__stream);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(resvec);
    cmd_local._4_4_ = (int)sVar3;
  }
  return cmd_local._4_4_;
}

Assistant:

int myexec(const char *cmd, vector<string> &resvec, bool dispResult)
{
    resvec.clear();
    FILE *pp = popen(cmd, "r");         //建立管道
    if(!pp) {
        return -1;
    }
    char tmp[1024];                     //设置一个合适的长度，以存储每一行输出
    while(fgets(tmp, sizeof(tmp), pp) != NULL) {
        if(tmp[strlen(tmp) - 1] == '\n') {
            tmp[strlen(tmp) - 1] = '\0';//去除换行符
        }
        if(dispResult) {
            cout<<tmp<<endl;
        }
        resvec.push_back(tmp);
    }
    pclose(pp); //关闭管道
    return resvec.size();
}